

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bignum.h
# Opt level: O1

void __thiscall double_conversion::Bignum::AssignHexString(Bignum *this,Vector<const_char> value)

{
  short sVar1;
  bool bVar2;
  ushort uVar3;
  int iVar4;
  ulong uVar5;
  ulong uVar6;
  int iVar7;
  long lVar8;
  int16_t iVar9;
  long lVar10;
  
  this->used_bigits_ = 0;
  this->exponent_ = 0;
  iVar4 = value.length_;
  if (0x380 < iVar4) {
    abort();
  }
  iVar7 = 0;
  if (iVar4 == 0) {
    uVar6 = 0;
  }
  else {
    iVar9 = this->used_bigits_;
    lVar8 = (long)iVar4;
    uVar6 = 0;
    do {
      iVar4 = (int)value.start_[lVar8 + -1];
      if (iVar4 - 0x30U < 10) {
        uVar5 = (ulong)(iVar4 - 0x30U);
      }
      else if (iVar4 - 0x61U < 6) {
        uVar5 = (ulong)(iVar4 - 0x57);
      }
      else {
        uVar5 = (long)iVar4 - 0x37;
      }
      uVar6 = uVar5 << ((byte)iVar7 & 0x3f) | uVar6;
      if (iVar7 < 0x18) {
        iVar7 = iVar7 + 4;
      }
      else {
        lVar10 = (long)iVar9;
        iVar9 = iVar9 + 1;
        this->used_bigits_ = iVar9;
        this->bigits_buffer_[lVar10] = (uint)uVar6 & 0xfffffff;
        iVar7 = iVar7 + -0x18;
        uVar6 = uVar6 >> 0x1c;
      }
      lVar8 = lVar8 + -1;
    } while (lVar8 != 0);
  }
  if (uVar6 != 0) {
    sVar1 = this->used_bigits_;
    this->used_bigits_ = sVar1 + 1;
    this->bigits_buffer_[sVar1] = (uint)uVar6 & 0xfffffff;
  }
  uVar3 = this->used_bigits_;
  if (0 < (short)uVar3) {
    do {
      if (this->bigits_buffer_[(ulong)uVar3 - 1] != 0) goto LAB_003e7dcb;
      this->used_bigits_ = uVar3 - 1;
      bVar2 = 1 < (short)uVar3;
      uVar3 = uVar3 - 1;
    } while (bVar2);
    uVar3 = 0;
  }
LAB_003e7dcb:
  if (uVar3 == 0) {
    this->exponent_ = 0;
    return;
  }
  return;
}

Assistant:

void Zero() {
    used_bigits_ = 0;
    exponent_ = 0;
  }